

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall
Parser_emptyModelString_Test::~Parser_emptyModelString_Test(Parser_emptyModelString_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, emptyModelString)
{
    const std::string e;
    const std::vector<std::string> expectedIssues = {
        "Model string is empty.",
    };

    libcellml::ParserPtr p = libcellml::Parser::create();
    p->parseModel(e);
    EXPECT_EQ_ISSUES(expectedIssues, p);
}